

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc *func)

{
  bool bVar1;
  TokenType TVar2;
  TokenType TVar3;
  TokenTypePair TVar4;
  int iVar5;
  Token token;
  string local_90;
  Token local_70;
  
  iVar5 = 10;
  do {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    TVar4._M_elems[1] = TVar3;
    TVar4._M_elems[0] = TVar2;
    bVar1 = (*func)(TVar4);
    if (bVar1) {
      return (Result)Ok;
    }
    Consume(&local_70,this);
    if (local_70.token_type_ == Reserved) {
      Token::to_string_clamp_abi_cxx11_(&local_90,&local_70,0x50);
      Error(this,0x196700,local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return (Result)Error;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}